

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.hpp
# Opt level: O0

void __thiscall bit_stream::bit_stream(bit_stream *this,uint32_t *f,bool write_stuff)

{
  uint32_t *puVar1;
  bool write_stuff_local;
  uint32_t *f_local;
  bit_stream *this_local;
  
  this->of = f;
  this->write_mode = write_stuff;
  this->first_ptr = this->buf;
  this->cur_ptr = this->first_ptr;
  this->last_ptr = this->buf + 1;
  this->in_word_offset = '\0';
  this->bytes_written = 0;
  this->bytes_consumed = 0;
  if ((this->write_mode & 1U) == 0) {
    puVar1 = this->of;
    this->of = puVar1 + 1;
    *this->first_ptr = *puVar1;
    this->bytes_consumed = this->bytes_consumed + 4;
  }
  return;
}

Assistant:

bit_stream(uint32_t* f, bool write_stuff)
        : of(f)
        , write_mode(write_stuff)
    {
        first_ptr = &buf[0];
        cur_ptr = first_ptr;
        last_ptr = &buf[1];
        in_word_offset = 0;
        bytes_written = 0;
        bytes_consumed = 0;
        if (!write_mode) { // fill the buffer with the first word
            *first_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
    }